

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void name_public_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  Fl_Class_Type *pFVar5;
  Fl_Type *pFVar6;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,(uint)(0 < current_widget->public_));
    pFVar5 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    pp_Var2 = (i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget;
    if (pFVar5 != (Fl_Class_Type *)0x0) {
      (*pp_Var2[6])();
      return;
    }
    (*pp_Var2[5])(i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar3 = false;
    pFVar6 = Fl_Type::first;
    do {
      if (pFVar6->selected != '\0') {
        iVar4 = (*pFVar6->_vptr_Fl_Type[0x17])(pFVar6);
        if (iVar4 != 0) {
          pFVar1 = (i->super_Fl_Menu_).value_;
          if (pFVar1 == (Fl_Menu_Item *)0x0) {
            iVar4 = -1;
          }
          else {
            iVar4 = (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249;
          }
          *(int *)&pFVar6[1].factory = iVar4;
          bVar3 = true;
        }
      }
      pFVar6 = pFVar6->next;
    } while (pFVar6 != (Fl_Type *)0x0);
    if (bVar3) {
      set_modflag(1);
      redraw_browser();
      return;
    }
  }
  return;
}

Assistant:

void name_public_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_>0);
    if (current_widget->is_in_class()) i->hide(); else i->show();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	((Fl_Widget_Type*)o)->public_ = i->value();
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}